

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderView::mouseMoveEvent(QHeaderView *this,QMouseEvent *e)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ResizeMode RVar9;
  QHeaderViewPrivate *pQVar10;
  QHeaderViewPrivate *this_00;
  CursorShape CVar11;
  undefined8 in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  int logical_1;
  bool hasCursor;
  int handle;
  int logical;
  int oldTarget;
  int moving;
  int checkPos;
  int posThreshold;
  int visual_1;
  int newsize;
  int delta_1;
  int visual;
  int delta;
  QHeaderViewPrivate *d;
  QStatusTipEvent tip;
  QString statusTip;
  int pos;
  QHeaderView *in_stack_fffffffffffffe58;
  MouseButton in_stack_fffffffffffffe60;
  int iVar12;
  WidgetAttribute in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  QFlagsStorage<Qt::MouseButton> in_stack_fffffffffffffe6c;
  uint visualIndex;
  QPointF *in_stack_fffffffffffffe70;
  QHeaderViewPrivate *this_01;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int local_164;
  int local_14c;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  QCursor local_b0;
  int local_a8;
  int local_a4;
  QPoint local_a0;
  QPoint local_98;
  QPoint local_90;
  QPointF local_88;
  QPoint local_74;
  int local_6c;
  int local_68;
  int local_64;
  QPointF local_60;
  QPoint local_50;
  QPointF local_48;
  QPoint local_34;
  int local_2c;
  QVariant local_28;
  long local_8;
  
  iVar3 = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = d_func((QHeaderView *)0x83ce0e);
  if (pQVar10->orientation == Horizontal) {
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)0x83ce34);
    local_34 = QPointF::toPoint(in_stack_fffffffffffffe70);
    local_164 = QPoint::x((QPoint *)0x83ce68);
  }
  else {
    local_60 = QSinglePointEvent::position((QSinglePointEvent *)0x83ce7b);
    local_50 = QPointF::toPoint(in_stack_fffffffffffffe70);
    local_164 = QPoint::y((QPoint *)0x83ceaf);
  }
  local_2c = local_164;
  if ((-1 < local_164) || (pQVar10->state == SelectSections)) {
    QSinglePointEvent::buttons
              ((QSinglePointEvent *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    bVar2 = ::operator==((QFlags<Qt::MouseButton>)in_stack_fffffffffffffe6c.i,
                         in_stack_fffffffffffffe60);
    if (bVar2) {
      pQVar10->state = NoState;
      pQVar10->pressed = -1;
      pQVar10->firstPressed = -1;
    }
    this_00 = (QHeaderViewPrivate *)(ulong)pQVar10->state;
    switch(this_00) {
    case (QHeaderViewPrivate *)0x0:
      iVar3 = QHeaderViewPrivate::sectionHandleAt(this_00,in_stack_fffffffffffffe8c);
      bVar2 = QWidget::testAttribute
                        ((QWidget *)CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                         in_stack_fffffffffffffe64);
      if ((iVar3 == -1) ||
         (RVar9 = sectionResizeMode((QHeaderView *)
                                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                    (int)((ulong)in_stack_fffffffffffffe70 >> 0x20)),
         RVar9 != Interactive)) {
        if (bVar2) {
          QWidget::unsetCursor
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68));
        }
        iVar3 = logicalIndexAt((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                               in_stack_fffffffffffffe64);
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x83d68f);
        if (iVar3 != -1) {
          pQVar1 = (pQVar10->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar1 + 0xa0))(&local_28,pQVar1,iVar3,pQVar10->orientation,4);
          ::QVariant::toString();
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             (QString *)in_stack_fffffffffffffe58);
          QString::~QString((QString *)0x83d705);
          ::QVariant::~QVariant(&local_28);
        }
        if ((((pQVar10->super_QAbstractItemViewPrivate).shouldClearStatusTip & 1U) != 0) ||
           (bVar2 = QString::isEmpty((QString *)0x83d730), !bVar2)) {
          memset(&stack0xfffffffffffffef8,0xaa,0x28);
          QStatusTipEvent::QStatusTipEvent
                    ((QStatusTipEvent *)&stack0xfffffffffffffef8,(QString *)&local_c8);
          if (*(long *)&(pQVar10->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        super_QFramePrivate.super_QWidgetPrivate.field_0x10 != 0) {
            in_RDI = *(QObject **)
                      &(pQVar10->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                       super_QFramePrivate.super_QWidgetPrivate.field_0x10;
          }
          QCoreApplication::sendEvent(in_RDI,(QEvent *)&stack0xfffffffffffffef8);
          bVar2 = QString::isEmpty((QString *)0x83d7ae);
          (pQVar10->super_QAbstractItemViewPrivate).shouldClearStatusTip =
               (bool)((bVar2 ^ 0xffU) & 1);
          QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)&stack0xfffffffffffffef8);
        }
        QString::~QString((QString *)0x83d7de);
      }
      else if (!bVar2) {
        CVar11 = SplitVCursor;
        if (pQVar10->orientation == Horizontal) {
          CVar11 = SplitHCursor;
        }
        QCursor::QCursor(&local_b0,CVar11);
        QWidget::setCursor((QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (QCursor *)in_stack_fffffffffffffe70);
        QCursor::~QCursor(&local_b0);
      }
      break;
    case (QHeaderViewPrivate *)0x1:
      if ((pQVar10->cascadingResizing & 1U) == 0) {
        bVar2 = QHeaderViewPrivate::reverse
                          ((QHeaderViewPrivate *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        if (bVar2) {
          iVar3 = pQVar10->firstPos - local_2c;
        }
        else {
          iVar3 = local_2c - pQVar10->firstPos;
        }
        local_64 = minimumSectionSize((QHeaderView *)in_stack_fffffffffffffe70);
        local_68 = pQVar10->originalSize + iVar3;
        local_6c = maximumSectionSize(in_stack_fffffffffffffe58);
        qBound<int>((int *)in_stack_fffffffffffffe70,
                    (int *)CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                    (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        resizeSection((QHeaderView *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
      }
      else {
        bVar2 = QHeaderViewPrivate::reverse
                          ((QHeaderViewPrivate *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        if (bVar2) {
          iVar4 = pQVar10->lastPos - local_2c;
        }
        else {
          iVar4 = local_2c - pQVar10->lastPos;
        }
        QHeaderView::visualIndex
                  ((QHeaderView *)CONCAT44(iVar4,in_stack_fffffffffffffe88),
                   (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        QHeaderViewPrivate::headerSectionSize
                  ((QHeaderViewPrivate *)
                   CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                   in_stack_fffffffffffffe64);
        QHeaderViewPrivate::cascadingResize
                  ((QHeaderViewPrivate *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec4,iVar3);
      }
      pQVar10->lastPos = local_2c;
      break;
    case (QHeaderViewPrivate *)0x2:
      this_01 = pQVar10;
      local_88 = QSinglePointEvent::position((QSinglePointEvent *)0x83d131);
      local_74 = QPointF::toPoint((QPointF *)this_01);
      bVar2 = QAbstractItemViewPrivate::shouldAutoScroll
                        (in_stack_fffffffffffffe80,
                         (QPoint *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      iVar3 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      if (bVar2) {
        local_98 = QMouseEvent::pos((QMouseEvent *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        local_a0 = QAbstractItemViewPrivate::offset(&this_01->super_QAbstractItemViewPrivate);
        local_90 = ::operator+((QPoint *)this_01,
                               (QPoint *)
                               CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68));
        (pQVar10->super_QAbstractItemViewPrivate).draggedPosition = local_90;
        QAbstractItemViewPrivate::startAutoScroll(&this_01->super_QAbstractItemViewPrivate);
      }
      local_a4 = local_2c - pQVar10->firstPos;
      iVar4 = qAbs<int>(&local_a4);
      iVar5 = QApplication::startDragDistance();
      visualIndex = CONCAT13(1,(int3)in_stack_fffffffffffffe6c.i);
      if (iVar4 < iVar5) {
        bVar2 = QWidget::isHidden((QWidget *)0x83d231);
        visualIndex = CONCAT13(bVar2,(int3)visualIndex) ^ 0xff000000;
      }
      if ((((visualIndex & 0x1000000) != 0) &&
          (iVar5 = visualIndexAt((QHeaderView *)
                                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                 (int)((ulong)this_01 >> 0x20)), iVar5 != -1)) &&
         ((iVar5 != 0 ||
          ((iVar6 = logicalIndex((QHeaderView *)CONCAT44(visualIndex,iVar4),
                                 in_stack_fffffffffffffe64), iVar6 != 0 ||
           ((pQVar10->allowUserMoveOfSection0 & 1U) != 0)))))) {
        iVar6 = QHeaderViewPrivate::headerSectionPosition
                          ((QHeaderViewPrivate *)CONCAT44(visualIndex,iVar4),
                           in_stack_fffffffffffffe64);
        iVar6 = iVar6 - pQVar10->headerOffset;
        iVar4 = QHeaderViewPrivate::headerSectionSize
                          ((QHeaderViewPrivate *)CONCAT44(visualIndex,iVar4),iVar6);
        iVar7 = iVar6 + iVar4 / 2;
        bVar2 = QHeaderViewPrivate::reverse
                          ((QHeaderViewPrivate *)CONCAT44(iVar6,in_stack_fffffffffffffe60));
        iVar4 = local_2c;
        if (bVar2) {
          iVar4 = QWidget::width((QWidget *)0x83d302);
          iVar4 = iVar4 - local_2c;
        }
        iVar12 = iVar4;
        iVar8 = QHeaderView::visualIndex
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),iVar3);
        iVar3 = pQVar10->target;
        if (iVar5 < iVar8) {
          if (iVar4 < iVar7) {
            iVar4 = QHeaderViewPrivate::logicalIndex(this_01,visualIndex);
            pQVar10->target = iVar4;
          }
          else {
            iVar4 = QHeaderViewPrivate::logicalIndex(this_01,visualIndex);
            pQVar10->target = iVar4;
          }
        }
        else if (iVar8 < iVar5) {
          if (iVar7 < iVar4) {
            iVar4 = QHeaderViewPrivate::logicalIndex(this_01,visualIndex);
            pQVar10->target = iVar4;
          }
          else {
            iVar4 = QHeaderViewPrivate::logicalIndex(this_01,visualIndex);
            pQVar10->target = iVar4;
          }
        }
        else {
          pQVar10->target = pQVar10->section;
        }
        if ((iVar3 != pQVar10->target) || (iVar3 == -1)) {
          QHeaderViewPrivate::updateSectionsBeforeAfter(this_00,in_stack_fffffffffffffe8c);
        }
        QHeaderViewPrivate::updateSectionIndicator
                  ((QHeaderViewPrivate *)CONCAT44(iVar6,iVar12),
                   (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58);
      }
      break;
    case (QHeaderViewPrivate *)0x3:
      local_a8 = -pQVar10->headerOffset;
      qMax<int>(&local_a8,&local_2c);
      iVar4 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      iVar3 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      local_14c = logicalIndexAt((QHeaderView *)
                                 CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                                 in_stack_fffffffffffffe64);
      if ((local_14c == -1) && (0 < local_2c)) {
        QHeaderViewPrivate::lastVisibleVisualIndex
                  ((QHeaderViewPrivate *)
                   CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68));
        local_14c = logicalIndex((QHeaderView *)
                                 CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                                 in_stack_fffffffffffffe64);
      }
      if (local_14c != pQVar10->pressed) {
        if (pQVar10->pressed != -1) {
          updateSection((QHeaderView *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                        ,iVar4);
        }
        pQVar10->pressed = local_14c;
        if (((pQVar10->clickableSections & 1U) != 0) && (local_14c != -1)) {
          sectionEntered((QHeaderView *)0x83d575,iVar3);
          updateSection((QHeaderView *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                        ,iVar4);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    const int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    if (pos < 0 && d->state != QHeaderViewPrivate::SelectSections)
        return;
    if (e->buttons() == Qt::NoButton) {
        // Under Cocoa, when the mouse button is released, may include an extra
        // simulated mouse moved event. The state of the buttons when this event
        // is generated is already "no button" and the code below gets executed
        // just before the mouseReleaseEvent and resets the state. This prevents
        // column dragging from working. So this code is disabled under Cocoa.
        d->state = QHeaderViewPrivate::NoState;
        d->firstPressed = d->pressed = -1;
    }
    switch (d->state) {
        case QHeaderViewPrivate::ResizeSection: {
            Q_ASSERT(d->originalSize != -1);
            if (d->cascadingResizing) {
                int delta = d->reverse() ? d->lastPos - pos : pos - d->lastPos;
                int visual = visualIndex(d->section);
                d->cascadingResize(visual, d->headerSectionSize(visual) + delta);
            } else {
                int delta = d->reverse() ? d->firstPos - pos : pos - d->firstPos;
                int newsize = qBound(minimumSectionSize(), d->originalSize + delta, maximumSectionSize());
                resizeSection(d->section, newsize);
            }
            d->lastPos = pos;
            return;
        }
        case QHeaderViewPrivate::MoveSection: {
            if (d->shouldAutoScroll(e->position().toPoint())) {
                d->draggedPosition = e->pos() + d->offset();
                d->startAutoScroll();
            }
            if (qAbs(pos - d->firstPos) >= QApplication::startDragDistance()
#if QT_CONFIG(label)
                || !d->sectionIndicator->isHidden()
#endif
                ) {
                int visual = visualIndexAt(pos);
                if (visual == -1)
                    return;
                if (visual == 0 && logicalIndex(0) == 0 && !d->allowUserMoveOfSection0)
                    return;

                const int posThreshold = d->headerSectionPosition(visual) - d->headerOffset + d->headerSectionSize(visual) / 2;
                const int checkPos = d->reverse() ? d->viewport->width() - pos : pos;
                int moving = visualIndex(d->section);
                int oldTarget = d->target;
                if (visual < moving) {
                    if (checkPos < posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual + 1);
                } else if (visual > moving) {
                    if (checkPos > posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual - 1);
                } else {
                    d->target = d->section;
                }
                if (oldTarget != d->target || oldTarget == -1)
                    d->updateSectionsBeforeAfter(d->target);
                d->updateSectionIndicator(d->section, pos);
            }
            return;
        }
        case QHeaderViewPrivate::SelectSections: {
            int logical = logicalIndexAt(qMax(-d->headerOffset, pos));
            if (logical == -1 && pos > 0)
                logical = logicalIndex(d->lastVisibleVisualIndex());
            if (logical == d->pressed)
                return; // nothing to do
            else if (d->pressed != -1)
                updateSection(d->pressed);
            d->pressed = logical;
            if (d->clickableSections && logical != -1) {
                emit sectionEntered(d->pressed);
                updateSection(d->pressed);
            }
            return;
        }
        case QHeaderViewPrivate::NoState: {
#ifndef QT_NO_CURSOR
            int handle = d->sectionHandleAt(pos);
            bool hasCursor = testAttribute(Qt::WA_SetCursor);
            if (handle != -1 && (sectionResizeMode(handle) == Interactive)) {
                if (!hasCursor)
                    setCursor(d->orientation == Qt::Horizontal ? Qt::SplitHCursor : Qt::SplitVCursor);
            } else {
                if (hasCursor)
                    unsetCursor();
#ifndef QT_NO_STATUSTIP
                int logical = logicalIndexAt(pos);
                QString statusTip;
                if (logical != -1)
                    statusTip = d->model->headerData(logical, d->orientation, Qt::StatusTipRole).toString();
                if (d->shouldClearStatusTip || !statusTip.isEmpty()) {
                    QStatusTipEvent tip(statusTip);
                    QCoreApplication::sendEvent(d->parent ? d->parent : this, &tip);
                    d->shouldClearStatusTip = !statusTip.isEmpty();
                }
#endif // !QT_NO_STATUSTIP
            }
#endif
            return;
        }
        default:
            break;
    }
}